

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O1

void demo_prepare_texture_image
               (demo *demo,uint32_t *tex_colors,texture_object *tex_obj,VkImageTiling tiling,
               VkImageUsageFlags usage,VkFlags required_props)

{
  VkImage *ppVVar1;
  VkDeviceMemory *ppVVar2;
  VkResult VVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  void *data;
  VkMemoryAllocateInfo mem_alloc;
  VkImageSubresource subres;
  VkSubresourceLayout layout;
  VkMemoryRequirements mem_reqs;
  VkImageCreateInfo image_create_info;
  void *local_100;
  VkMemoryAllocateInfo local_f8;
  VkImageSubresource local_d8;
  VkSubresourceLayout local_c8;
  VkMemoryRequirements local_a0;
  VkImageCreateInfo local_88;
  
  tex_obj->tex_width = 2;
  tex_obj->tex_height = 2;
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.flags = 0;
  local_88.imageType = VK_IMAGE_TYPE_2D;
  local_88.format = VK_FORMAT_B8G8R8A8_UNORM;
  local_88.extent.width = 2;
  local_88.extent.height = 2;
  local_88.extent.depth = 1;
  local_88.mipLevels = 1;
  local_88.arrayLayers = 1;
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 0;
  local_88.pQueueFamilyIndices = (uint32_t *)0x0;
  local_88.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;
  local_f8.allocationSize = 0;
  local_f8.memoryTypeIndex = 0;
  local_f8._28_4_ = 0;
  local_f8.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_f8._4_4_ = 0;
  local_f8.pNext = (void *)0x0;
  ppVVar1 = &tex_obj->image;
  local_88.tiling = tiling;
  local_88.usage = usage;
  VVar3 = (*glad_vkCreateImage)(demo->device,&local_88,(VkAllocationCallbacks *)0x0,ppVVar1);
  if (VVar3 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                  ,0x3b2,
                  "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                 );
  }
  (*glad_vkGetImageMemoryRequirements)(demo->device,*ppVVar1,&local_a0);
  local_f8.allocationSize = local_a0.size;
  bVar7 = true;
  uVar4 = 0;
  while (((local_a0.memoryTypeBits & 1) == 0 ||
         ((required_props & ~(demo->memory_properties).memoryTypes[uVar4].propertyFlags) != 0))) {
    local_a0.memoryTypeBits = local_a0.memoryTypeBits >> 1;
    bVar7 = uVar4 < 0x1f;
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x20) {
LAB_00111010:
      if (!bVar7) {
        __assert_fail("pass",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                      ,0x3ba,
                      "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                     );
      }
      ppVVar2 = &tex_obj->mem;
      VVar3 = (*glad_vkAllocateMemory)(demo->device,&local_f8,(VkAllocationCallbacks *)0x0,ppVVar2);
      if (VVar3 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                      ,0x3be,
                      "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                     );
      }
      VVar3 = (*glad_vkBindImageMemory)(demo->device,*ppVVar1,*ppVVar2,0);
      if (VVar3 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                      ,0x3c2,
                      "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                     );
      }
      if ((required_props & 2) != 0) {
        local_d8.arrayLayer = 0;
        local_d8.aspectMask = 1;
        local_d8.mipLevel = 0;
        (*glad_vkGetImageSubresourceLayout)(demo->device,*ppVVar1,&local_d8,&local_c8);
        VVar3 = (*glad_vkMapMemory)(demo->device,*ppVVar2,0,local_f8.allocationSize,0,&local_100);
        if (VVar3 != VK_SUCCESS) {
          __assert_fail("!err",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                        ,0x3d3,
                        "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                       );
        }
        lVar5 = 0;
        do {
          lVar6 = 0;
          do {
            *(uint32_t *)((long)local_100 + lVar6 * 4) = tex_colors[(uint)lVar6 ^ (uint)lVar5];
            lVar6 = lVar6 + 1;
          } while (lVar6 == 1);
          local_100 = (void *)((long)local_100 + local_c8.rowPitch);
          bVar7 = lVar5 == 0;
          lVar5 = lVar5 + 1;
        } while (bVar7);
        (*glad_vkUnmapMemory)(demo->device,*ppVVar2);
      }
      tex_obj->imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
      demo_set_image_layout
                (demo,tex_obj->image,1,VK_IMAGE_LAYOUT_PREINITIALIZED,
                 VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,VK_ACCESS_HOST_WRITE_BIT);
      return;
    }
  }
  local_f8.memoryTypeIndex = (uint32_t)uVar4;
  goto LAB_00111010;
}

Assistant:

static void
demo_prepare_texture_image(struct demo *demo, const uint32_t *tex_colors,
                           struct texture_object *tex_obj, VkImageTiling tiling,
                           VkImageUsageFlags usage, VkFlags required_props) {
    const VkFormat tex_format = VK_FORMAT_B8G8R8A8_UNORM;
    const int32_t tex_width = 2;
    const int32_t tex_height = 2;
    VkResult U_ASSERT_ONLY err;
    bool U_ASSERT_ONLY pass;

    tex_obj->tex_width = tex_width;
    tex_obj->tex_height = tex_height;

    const VkImageCreateInfo image_create_info = {
        .sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
        .pNext = NULL,
        .imageType = VK_IMAGE_TYPE_2D,
        .format = tex_format,
        .extent = {tex_width, tex_height, 1},
        .mipLevels = 1,
        .arrayLayers = 1,
        .samples = VK_SAMPLE_COUNT_1_BIT,
        .tiling = tiling,
        .usage = usage,
        .flags = 0,
        .initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED
    };
    VkMemoryAllocateInfo mem_alloc = {
        .sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
        .pNext = NULL,
        .allocationSize = 0,
        .memoryTypeIndex = 0,
    };

    VkMemoryRequirements mem_reqs;

    err =
        vkCreateImage(demo->device, &image_create_info, NULL, &tex_obj->image);
    assert(!err);

    vkGetImageMemoryRequirements(demo->device, tex_obj->image, &mem_reqs);

    mem_alloc.allocationSize = mem_reqs.size;
    pass =
        memory_type_from_properties(demo, mem_reqs.memoryTypeBits,
                                    required_props, &mem_alloc.memoryTypeIndex);
    assert(pass);

    /* allocate memory */
    err = vkAllocateMemory(demo->device, &mem_alloc, NULL, &tex_obj->mem);
    assert(!err);

    /* bind memory */
    err = vkBindImageMemory(demo->device, tex_obj->image, tex_obj->mem, 0);
    assert(!err);

    if (required_props & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) {
        const VkImageSubresource subres = {
            .aspectMask = VK_IMAGE_ASPECT_COLOR_BIT,
            .mipLevel = 0,
            .arrayLayer = 0,
        };
        VkSubresourceLayout layout;
        void *data;
        int32_t x, y;

        vkGetImageSubresourceLayout(demo->device, tex_obj->image, &subres,
                                    &layout);

        err = vkMapMemory(demo->device, tex_obj->mem, 0,
                          mem_alloc.allocationSize, 0, &data);
        assert(!err);

        for (y = 0; y < tex_height; y++) {
            uint32_t *row = (uint32_t *)((char *)data + layout.rowPitch * y);
            for (x = 0; x < tex_width; x++)
                row[x] = tex_colors[(x & 1) ^ (y & 1)];
        }

        vkUnmapMemory(demo->device, tex_obj->mem);
    }

    tex_obj->imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
    demo_set_image_layout(demo, tex_obj->image, VK_IMAGE_ASPECT_COLOR_BIT,
                          VK_IMAGE_LAYOUT_PREINITIALIZED, tex_obj->imageLayout,
                          VK_ACCESS_HOST_WRITE_BIT);
    /* setting the image layout does not reference the actual memory so no need
     * to add a mem ref */
}